

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
* __thiscall
Memory::
AllocateArray<Memory::Recycler,JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>>,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  *pSVar2;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
  *pSVar3;
  size_t byteSize;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pSVar2 = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
              *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pSVar2 = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
              *)new__<Memory::Recycler>
                          (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    pSVar3 = pSVar2;
    do {
      (pSVar3->
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
      .
      super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
      .value.ptr = (CaseInvariantPropertyListWithHashCode *)0x0;
      (pSVar3->
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>_>
      .
      super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>,_Memory::WriteBarrierPtr<Js::CaseInvariantPropertyListWithHashCode>_>
      .key.ptr = (CaseInvariantPropertyListWithHashCode *)0x0;
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2 + count);
  }
  return pSVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}